

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O1

HelicsFilter
anon_unknown.dwarf_bbcfa::coreAddFilter
          (HelicsCore core,
          unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *filt)

{
  int iVar1;
  FilterObject *pFVar2;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *puVar3;
  ulong uVar4;
  const_iterator __position;
  ulong uVar5;
  
  pFVar2 = (filt->_M_t).
           super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>.
           _M_t.
           super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>
           .super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl;
  pFVar2->valid = -0x13d9fed9;
  __position._M_current =
       *(unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> **)
        ((long)core + 0x10);
  puVar3 = *(unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> **)
            ((long)core + 0x18);
  if ((__position._M_current == puVar3) ||
     (iVar1 = (pFVar2->filtPtr->super_Interface).handle.hid,
     ((puVar3[-1]._M_t.
       super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>._M_t.
       super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>.
       super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl)->filtPtr->super_Interface)
     .handle.hid < iVar1)) {
    std::
    vector<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>,std::allocator<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>>>
    ::emplace_back<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>>
              ((vector<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>,std::allocator<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>>>
                *)((long)core + 0x10),filt);
  }
  else {
    uVar5 = (long)puVar3 - (long)__position._M_current >> 3;
    while (uVar4 = uVar5, 0 < (long)uVar4) {
      uVar5 = uVar4 >> 1;
      if (((__position._M_current[uVar5]._M_t.
            super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>.
            _M_t.
            super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>
            .super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl)->filtPtr->
          super_Interface).handle.hid <= iVar1) {
        __position._M_current = __position._M_current + uVar5 + 1;
        uVar5 = ~uVar5 + uVar4;
      }
    }
    std::
    vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
    ::_M_insert_rval((vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
                      *)((long)core + 0x10),__position,filt);
  }
  return pFVar2;
}

Assistant:

HelicsFilter coreAddFilter(HelicsCore core, std::unique_ptr<helics::FilterObject> filt)
{
    auto* coreObj = reinterpret_cast<helics::CoreObject*>(core);
    filt->valid = filterValidationIdentifier;
    HelicsFilter hfilt = filt.get();
    if (coreObj->filters.empty() || filt->filtPtr->getHandle() > coreObj->filters.back()->filtPtr->getHandle()) {
        coreObj->filters.push_back(std::move(filt));
    } else {
        auto ind = std::upper_bound(coreObj->filters.begin(), coreObj->filters.end(), filt->filtPtr->getHandle(), filterSearch);
        coreObj->filters.insert(ind, std::move(filt));
    }
    return hfilt;
}